

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

void __thiscall gutil::PropertyNode::addChild(PropertyNode *this,string *_name,string *_value)

{
  PropertyNode *this_00;
  long lVar1;
  shared_ptr<gutil::PropertyNode> *psVar2;
  string local_68;
  string local_48;
  
  lVar1 = std::__cxx11::string::find((char)_name,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)_name);
    psVar2 = getChild(this,&local_48);
    this_00 = (psVar2->super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::substr((ulong)&local_68,(ulong)_name);
    addChild(this_00,&local_68,_value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  psVar2 = getChild(this,_name);
  std::__cxx11::string::_M_assign
            ((string *)
             &((psVar2->super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->value);
  return;
}

Assistant:

void addChild(const std::string &_name, const std::string &_value)
    {
      size_t i=_name.find_first_of('.');

      if (i != std::string::npos)
      {
        getChild(_name.substr(0, i))->addChild(_name.substr(i+1), _value);
      }
      else
      {
        getChild(_name)->setValue(_value);
      }
    }